

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

int Lodtalk::Behavior::stBasicNewSize(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Object *pOVar4;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  iVar3 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
  if ((uVar2 & 1) != 0) {
    pOVar4 = basicNativeNew((Behavior *)CONCAT44(extraout_var_01,iVar1),
                            (VMContext *)CONCAT44(extraout_var_02,iVar3),
                            CONCAT44(extraout_var_00,uVar2) >> 1);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,pOVar4);
    return iVar1;
  }
  __assert_fail("isSmallInteger()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
}

Assistant:

int Behavior::stBasicNewSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop size = interpreter->getTemporary(0);
    auto self = reinterpret_cast<Behavior*> (interpreter->getReceiver().pointer);
    return interpreter->returnOop(Oop::fromPointer(self->basicNativeNew(interpreter->getContext(), size.decodeSmallInteger())));
}